

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O1

int32_t new_entity(ecs_world_t *world,ecs_entity_t entity,ecs_entity_info_t *info,
                  ecs_table_t *new_table,ecs_entities_t *added)

{
  uint row;
  int32_t iVar1;
  ecs_data_t *data;
  ecs_record_t *record;
  uint uVar2;
  
  record = info->record;
  data = ecs_table_get_or_create_data(new_table);
  _ecs_assert(added != (ecs_entities_t *)0x0,0xc,(char *)0x0,"added != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x3ad);
  if (added == (ecs_entities_t *)0x0) {
    __assert_fail("added != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x3ad,
                  "int32_t new_entity(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_entities_t *)"
                 );
  }
  if (record == (ecs_record_t *)0x0) {
    record = (ecs_record_t *)_ecs_sparse_get_or_create((world->store).entity_index,0x10,entity);
  }
  row = ecs_table_append(world,new_table,data,entity,record,true);
  record->table = new_table;
  uVar2 = ~row;
  if (info->is_watched == false) {
    uVar2 = row + 1;
  }
  record->row = uVar2;
  iVar1 = ecs_vector_count(data->entities);
  _ecs_assert((int)row < iVar1,0xc,(char *)0x0,"ecs_vector_count(new_data[0].entities) > new_row",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x3bb);
  iVar1 = ecs_vector_count(data->entities);
  if ((int)row < iVar1) {
    if ((new_table->flags & 0x1a884) != 0) {
      ecs_run_add_actions(world,new_table,data,row,1,added,true,true);
      if ((new_table->flags & 0x8000) != 0) {
        ecs_run_monitors(world,new_table,new_table->monitors,row,1,(ecs_vector_t *)0x0);
      }
    }
    info->data = data;
    return row;
  }
  __assert_fail("ecs_vector_count(new_data[0].entities) > new_row",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x3bb,
                "int32_t new_entity(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_entities_t *)"
               );
}

Assistant:

static
int32_t new_entity(
    ecs_world_t * world,
    ecs_entity_t entity,
    ecs_entity_info_t * info,
    ecs_table_t * new_table,
    ecs_entities_t * added)
{
    ecs_record_t *record = info->record;
    ecs_data_t *new_data = ecs_table_get_or_create_data(new_table);
    int32_t new_row;

    ecs_assert(added != NULL, ECS_INTERNAL_ERROR, NULL);

    if (!record) {
        record = ecs_eis_get_or_create(world, entity);
    }

    new_row = ecs_table_append(
        world, new_table, new_data, entity, record, true);

    record->table = new_table;
    record->row = ecs_row_to_record(new_row, info->is_watched);

    ecs_assert(
        ecs_vector_count(new_data[0].entities) > new_row, 
        ECS_INTERNAL_ERROR, NULL);    

    if (new_table->flags & EcsTableHasAddActions) {
        ecs_run_add_actions(
            world, new_table, new_data, new_row, 1, added, true, true);

        if (new_table->flags & EcsTableHasMonitors) {
            ecs_run_monitors(
                world, new_table, new_table->monitors, new_row, 1, NULL);              
        }        
    }

    info->data = new_data;
    
    return new_row;
}